

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

SPARSE_TEXTURE_FLAGS
Diligent::VkSparseImageFormatFlagsToSparseTextureFlags(VkSparseImageFormatFlags Flags)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  SPARSE_TEXTURE_FLAGS local_d;
  VkSparseImageFormatFlagBits FlagBit;
  SPARSE_TEXTURE_FLAGS Result;
  VkSparseImageFormatFlags Flags_local;
  
  local_d = SPARSE_TEXTURE_FLAG_NONE;
  FlagBit = Flags;
  while (FlagBit != 0) {
    msg.field_2._12_4_ = ExtractLSB<unsigned_int>(&FlagBit);
    if (msg.field_2._12_4_ == 1) {
      operator|=(&local_d,SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL);
    }
    else if (msg.field_2._12_4_ == 2) {
      operator|=(&local_d,SPARSE_TEXTURE_FLAG_ALIGNED_MIP_SIZE);
    }
    else if (msg.field_2._12_4_ == 4) {
      operator|=(&local_d,SPARSE_TEXTURE_FLAG_LAST);
    }
    else {
      FormatString<char[36]>
                ((string *)local_38,(char (*) [36])"Unexpected sparse image format flag");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"VkSparseImageFormatFlagsToSparseTextureFlags",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x838);
      std::__cxx11::string::~string((string *)local_38);
    }
  }
  return local_d;
}

Assistant:

SPARSE_TEXTURE_FLAGS VkSparseImageFormatFlagsToSparseTextureFlags(VkSparseImageFormatFlags Flags)
{
    SPARSE_TEXTURE_FLAGS Result = SPARSE_TEXTURE_FLAG_NONE;
    while (Flags != 0)
    {
        VkSparseImageFormatFlagBits FlagBit = static_cast<VkSparseImageFormatFlagBits>(ExtractLSB(Flags));
        static_assert(SPARSE_TEXTURE_FLAG_LAST == (1u << 2), "This function must be updated to handle new sparse texture flag");
        switch (FlagBit)
        {
            // clang-format off
            case VK_SPARSE_IMAGE_FORMAT_SINGLE_MIPTAIL_BIT:         Result |= SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL;         break;
            case VK_SPARSE_IMAGE_FORMAT_ALIGNED_MIP_SIZE_BIT:       Result |= SPARSE_TEXTURE_FLAG_ALIGNED_MIP_SIZE;       break;
            case VK_SPARSE_IMAGE_FORMAT_NONSTANDARD_BLOCK_SIZE_BIT: Result |= SPARSE_TEXTURE_FLAG_NONSTANDARD_BLOCK_SIZE; break;
            // clang-format on
            default:
                UNEXPECTED("Unexpected sparse image format flag");
        }
    }
    return Result;
}